

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<Js::InternalString>
          (BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,InternalString *key)

{
  Type piVar1;
  Type pSVar2;
  bool bVar3;
  hash_t hashCode;
  uint uVar4;
  int iVar5;
  long lVar6;
  Type this_00;
  int *piVar7;
  
  piVar1 = this->buckets;
  if (piVar1 == (Type)0x0) {
    uVar4 = 0;
  }
  else {
    hashCode = GetHashCodeWithKey<Js::InternalString>(key);
    uVar4 = GetBucket(this,hashCode);
    pSVar2 = this->entries;
    piVar7 = piVar1 + uVar4;
    uVar4 = 0;
    while( true ) {
      iVar5 = *piVar7;
      lVar6 = (long)iVar5;
      if (lVar6 < 0) break;
      bVar3 = Js::InternalStringComparer::Equals
                        (&pSVar2[lVar6].
                          super_DefaultHashedEntry<Js::InternalString,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          .super_KeyValueEntry<Js::InternalString,_Value_*>.
                          super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Value_*>_>
                          .super_KeyValueEntryDataLayout2<Js::InternalString,_Value_*>.key,key);
      if (bVar3) {
        this_00 = this->stats;
        goto LAB_0044efe5;
      }
      uVar4 = uVar4 + 1;
      piVar7 = &pSVar2[lVar6].
                super_DefaultHashedEntry<Js::InternalString,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Js::InternalString,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Value_*>_>
                .super_KeyValueEntryDataLayout2<Js::InternalString,_Value_*>.next;
    }
  }
  this_00 = this->stats;
  iVar5 = -1;
LAB_0044efe5:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar4);
  }
  return iVar5;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }